

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::AttachToGraph
               (aiNode *attach,
               vector<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               *srcList)

{
  uint uVar1;
  aiNode **__src;
  aiNode *paVar2;
  pointer pNVar3;
  aiNode **ppaVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  while( true ) {
    uVar1 = attach->mNumChildren;
    uVar6 = (ulong)uVar1;
    if (uVar6 <= uVar8) break;
    AttachToGraph(attach->mChildren[uVar8],srcList);
    uVar8 = uVar8 + 1;
  }
  iVar5 = 0;
  for (pNVar3 = (srcList->
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pNVar3 != (srcList->
                super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                )._M_impl.super__Vector_impl_data._M_finish; pNVar3 = pNVar3 + 1) {
    if (pNVar3->attachToNode == attach) {
      iVar5 = iVar5 + (pNVar3->resolved ^ 1);
    }
  }
  if (iVar5 != 0) {
    ppaVar4 = (aiNode **)operator_new__((ulong)(uVar1 + iVar5) << 3);
    uVar7 = 0;
    uVar8 = 0;
    if (uVar1 != 0) {
      __src = attach->mChildren;
      memcpy(ppaVar4,__src,uVar6 * 8);
      uVar8 = uVar6;
      if (__src != (aiNode **)0x0) {
        operator_delete__(__src);
        uVar8 = (ulong)attach->mNumChildren;
      }
    }
    attach->mChildren = ppaVar4;
    ppaVar4 = ppaVar4 + uVar8;
    attach->mNumChildren = iVar5 + (int)uVar8;
    while( true ) {
      uVar8 = (ulong)uVar7;
      pNVar3 = (srcList->
               super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(srcList->
                        super__Vector_base<Assimp::NodeAttachmentInfo,_std::allocator<Assimp::NodeAttachmentInfo>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3 >> 5) <= uVar8)
      break;
      if ((pNVar3[uVar8].attachToNode == attach) &&
         (pNVar3 = pNVar3 + uVar8, pNVar3->resolved == false)) {
        paVar2 = pNVar3->node;
        *ppaVar4 = paVar2;
        paVar2->mParent = attach;
        ppaVar4 = ppaVar4 + 1;
        pNVar3->resolved = true;
      }
      uVar7 = uVar7 + 1;
    }
  }
  return;
}

Assistant:

void SceneCombiner::AttachToGraph (aiNode* attach, std::vector<NodeAttachmentInfo>& srcList) {
    unsigned int cnt;
    for ( cnt = 0; cnt < attach->mNumChildren; ++cnt ) {
        AttachToGraph( attach->mChildren[ cnt ], srcList );
    }

    cnt = 0;
    for (std::vector<NodeAttachmentInfo>::iterator it = srcList.begin();
         it != srcList.end(); ++it)
    {
        if ((*it).attachToNode == attach && !(*it).resolved)
            ++cnt;
    }

    if (cnt)    {
        aiNode** n = new aiNode*[cnt+attach->mNumChildren];
        if (attach->mNumChildren)   {
            ::memcpy(n,attach->mChildren,sizeof(void*)*attach->mNumChildren);
            delete[] attach->mChildren;
        }
        attach->mChildren = n;

        n += attach->mNumChildren;
        attach->mNumChildren += cnt;

        for (unsigned int i = 0; i < srcList.size();++i)    {
            NodeAttachmentInfo& att = srcList[i];
            if (att.attachToNode == attach && !att.resolved)    {
                *n = att.node;
                (**n).mParent = attach;
                ++n;

                // mark this attachment as resolved
                att.resolved = true;
            }
        }
    }
}